

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

void __thiscall QtIcoHandler::QtIcoHandler(QtIcoHandler *this,QIODevice *device)

{
  ICOReader *pIVar1;
  
  QImageIOHandler::QImageIOHandler(&this->super_QImageIOHandler);
  *(undefined ***)this = &PTR__QtIcoHandler_00109a78;
  this->knownCanRead = false;
  this->m_currentIconIndex = 0;
  QImageIOHandler::setDevice((QIODevice *)this);
  pIVar1 = (ICOReader *)operator_new(0x48);
  pIVar1->iod = device;
  pIVar1->startpos = 0;
  pIVar1->headerRead = false;
  this->m_pICOReader = pIVar1;
  return;
}

Assistant:

QtIcoHandler::QtIcoHandler(QIODevice *device)
{
    m_currentIconIndex = 0;
    setDevice(device);
    m_pICOReader = new ICOReader(device);
}